

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f,int horn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  param512_t *papVar4;
  int z;
  int iVar5;
  qnode_ptr_t ptVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  qnode_ptr_t q;
  int iVar10;
  long lVar11;
  uint x;
  float fVar12;
  
  x = f->ofst;
  q = (qnode_ptr_t)(ulong)x;
  while( true ) {
    iVar9 = f->sizy;
    iVar8 = (int)q;
    iVar10 = iVar9 - iVar8;
    ptVar6 = q;
    if (iVar10 <= (int)x) break;
    while (iVar9 = (int)ptVar6, iVar9 < f->sizx - (int)q) {
      for (lVar11 = 0; lVar11 < f->sizz; lVar11 = lVar11 + 1) {
        fVar12 = dx(c,f,x,iVar9,(int)lVar11);
        (*f->param_ptr[lVar11])[(int)(f->res * x + iVar9)].fx = fVar12;
        fVar12 = dy(c,f,x,iVar9,(int)lVar11);
        (*f->param_ptr[lVar11])[(int)(f->res * x + iVar9)].fy = fVar12;
      }
      q = (qnode_ptr_t)(ulong)(uint)f->ofst;
      ptVar6 = (qnode_ptr_t)(ulong)(iVar9 + 1);
    }
    x = x + 1;
  }
  z = c->sizz / 2;
  while (iVar5 = (int)ptVar6, iVar5 < iVar10) {
    iVar3 = f->sizx;
    for (lVar11 = (long)iVar8; (int)lVar11 < iVar3 - iVar8; lVar11 = lVar11 + 1) {
      papVar4 = f->param_ptr[z];
      lVar7 = (long)f->res * (long)iVar5 + lVar11;
      if ((*papVar4)[lVar7].err == 0) {
        fVar12 = dt(c,q,iVar5,(int)lVar11);
        (*papVar4)[lVar7].ft = fVar12;
      }
    }
    ptVar6 = (qnode_ptr_t)(ulong)(iVar5 + 1);
  }
  ptVar6 = q;
  if (horn == 0) {
    while( true ) {
      iVar10 = iVar9 - (int)q;
      iVar8 = (int)ptVar6;
      if (iVar10 <= iVar8) break;
      lVar11 = (long)iVar8;
      for (lVar7 = (long)(int)q; iVar9 = (int)lVar7, iVar9 < f->sizx - (int)q; lVar7 = lVar7 + 1) {
        if ((*f->param_ptr[z])[f->res * lVar11 + lVar7].err == 0) {
          fVar12 = dxx(f,iVar8,iVar9,z);
          (*f->param_ptr[z])[f->res * lVar11 + lVar7].fxx = fVar12;
          fVar12 = dyy(f,iVar8,iVar9,z);
          (*f->param_ptr[z])[f->res * lVar11 + lVar7].fyy = fVar12;
          fVar12 = dxy(f,iVar8,iVar9,z);
          (*f->param_ptr[z])[f->res * lVar11 + lVar7].fxy = fVar12;
          q = (qnode_ptr_t)(ulong)(uint)f->ofst;
        }
      }
      iVar9 = f->sizy;
      ptVar6 = (qnode_ptr_t)(ulong)(iVar8 + 1);
    }
  }
  iVar9 = (int)q;
  while (iVar8 = (int)q, iVar8 < iVar10) {
    iVar5 = f->sizx;
    for (lVar11 = (long)iVar9; (int)lVar11 < iVar5 - iVar9; lVar11 = lVar11 + 1) {
      papVar4 = f->param_ptr[z];
      lVar7 = (long)f->res * (long)iVar8 + lVar11;
      if ((*papVar4)[lVar7].err == 0) {
        uVar1 = (*papVar4)[lVar7].fx;
        uVar2 = (*papVar4)[lVar7].fy;
        (*papVar4)[lVar7].mag = SQRT((float)uVar2 * (float)uVar2 + (float)uVar1 * (float)uVar1);
      }
    }
    q = (qnode_ptr_t)(ulong)(iVar8 + 1);
  }
  return;
}

Assistant:

void compute_deriv(qnode_ptr_t c, qnode_ptr_t f, int horn)
{ float dxx(), dyy(), dxy(), dx(), dy(), dt() ;
  param_t P ;
  int i, j, k ;

  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
      }
    }
  }
  if (!horn) {
    for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
      for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
        if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
          (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
        }
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        P = (*f->param_ptr[k])[f->res*i + j] ;
        (*f->param_ptr[k])[f->res*i + j].mag =
        sqrt(pow(P.fx,2.0) + pow(P.fy,2.0)) ;
      }
    }
  }
}